

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O1

ByteData256 * __thiscall
cfd::core::TapBranch::GetBranchHash
          (ByteData256 *__return_storage_ptr__,TapBranch *this,uint8_t depth)

{
  pointer puVar1;
  byte bVar2;
  int iVar3;
  HashUtil *pHVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar5;
  ulong __n;
  ulong uVar6;
  byte bVar7;
  pointer this_00;
  ulong uVar8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar9;
  bool bVar10;
  HashUtil hasher;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> nodes;
  ByteData tapbranch_base;
  ByteData256 local_e8;
  undefined1 local_d0 [40];
  ByteData256 *local_a8;
  HashUtil local_a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_60;
  ByteData local_48;
  
  GetBaseHash(__return_storage_ptr__,this);
  if ((this->branch_list_).
      super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->branch_list_).
      super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    if (GetBranchHash(unsigned_char)::kTaggedHash == '\0') {
      iVar3 = __cxa_guard_acquire(&GetBranchHash(unsigned_char)::kTaggedHash);
      if (iVar3 != 0) {
        local_d0._0_8_ = local_d0 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"TapBranch","");
        HashUtil::Sha256(&GetBranchHash::kTaggedHash,(string *)local_d0);
        if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
          operator_delete((void *)local_d0._0_8_);
        }
        __cxa_atexit(ByteData256::~ByteData256,&GetBranchHash::kTaggedHash,&__dso_handle);
        __cxa_guard_release(&GetBranchHash(unsigned_char)::kTaggedHash);
      }
    }
    ByteData256::Concat<cfd::core::ByteData256>
              (&local_48,&GetBranchHash::kTaggedHash,&GetBranchHash::kTaggedHash);
    (*this->_vptr_TapBranch[4])(&local_60,this);
    local_a8 = local_60.
               super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    if (local_60.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_60.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      this_00 = local_60.
                super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
                _M_impl.super__Vector_impl_data._M_start;
      bVar7 = 0;
      do {
        bVar2 = bVar7;
        if (bVar7 <= depth) {
          HashUtil::HashUtil(&local_a0,'\x03');
          pHVar4 = HashUtil::operator<<(&local_a0,&local_48);
          HashUtil::HashUtil((HashUtil *)local_d0,pHVar4);
          local_a0._vptr_HashUtil = (_func_int **)&PTR__HashUtil_00690568;
          if (local_a0.buffer_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a0.buffer_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          ByteData256::GetBytes
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a0,this_00);
          pvVar5 = ByteData256::GetBytes(&local_78,__return_storage_ptr__);
          uVar8 = (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
          uVar6 = local_a0._8_8_ - (long)local_a0._vptr_HashUtil;
          __n = uVar8;
          if (uVar6 < uVar8) {
            __n = uVar6;
          }
          if (__n == 0) {
            bVar10 = true;
          }
          else {
            iVar3 = memcmp(local_78.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,local_a0._vptr_HashUtil,__n);
            bVar10 = iVar3 == 0;
            pvVar5 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(long)iVar3;
          }
          pvVar9 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(uVar8 - uVar6);
          if (!bVar10) {
            pvVar9 = pvVar5;
          }
          if ((long)pvVar9 < 0) {
            pHVar4 = HashUtil::operator<<((HashUtil *)local_d0,__return_storage_ptr__);
            pHVar4 = HashUtil::operator<<(pHVar4,this_00);
            HashUtil::Output256(&local_e8,pHVar4);
          }
          else {
            pHVar4 = HashUtil::operator<<((HashUtil *)local_d0,this_00);
            pHVar4 = HashUtil::operator<<(pHVar4,__return_storage_ptr__);
            HashUtil::Output256(&local_e8,pHVar4);
          }
          puVar1 = (__return_storage_ptr__->data_).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          (__return_storage_ptr__->data_).
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
          (__return_storage_ptr__->data_).
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          (__return_storage_ptr__->data_).
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
          local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (puVar1 != (pointer)0x0) {
            operator_delete(puVar1);
          }
          if (local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_e8.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_a0._vptr_HashUtil != (_func_int **)0x0) {
            operator_delete(local_a0._vptr_HashUtil);
          }
          local_d0._0_8_ = &PTR__HashUtil_00690568;
          if ((pointer)local_d0._16_8_ != (pointer)0x0) {
            operator_delete((void *)local_d0._16_8_);
          }
          bVar2 = bVar7 + 1;
        }
      } while ((bVar7 <= depth) && (this_00 = this_00 + 1, bVar7 = bVar2, this_00 != local_a8));
    }
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_60);
    if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData256 TapBranch::GetBranchHash(uint8_t depth) const {
  ByteData256 hash = GetBaseHash();
  if (branch_list_.empty()) return hash;

  static auto kTaggedHash = HashUtil::Sha256("TapBranch");
  ByteData tapbranch_base = kTaggedHash.Concat(kTaggedHash);
  auto nodes = GetNodeList();
  uint8_t index = 0;
  for (const auto& node : nodes) {
    if (index > depth) break;
    auto hasher = HashUtil(HashUtil::kSha256) << tapbranch_base;
    const auto& node_bytes = node.GetBytes();
    const auto& hash_bytes = hash.GetBytes();
    if (std::lexicographical_compare(
            hash_bytes.begin(), hash_bytes.end(), node_bytes.begin(),
            node_bytes.end())) {
      hash = (hasher << hash << node).Output256();
    } else {
      hash = (hasher << node << hash).Output256();
    }
    ++index;
  }
  return hash;
}